

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RC __thiscall RM_FileHandle::SetBit(RM_FileHandle *this,char *bitmap,int size,int bitnum)

{
  if (size < bitnum) {
    return 0x68;
  }
  bitmap[(int)((long)bitnum / 8)] =
       bitmap[(int)((long)bitnum / 8)] |
       (byte)(1 << ((char)bitnum + (char)((long)bitnum / 8) * -8 & 0x1fU));
  return 0;
}

Assistant:

RC RM_FileHandle::SetBit(char *bitmap, int size, int bitnum){
  if (bitnum > size)
    return (RM_INVALIDBITOPERATION);
  int chunk = bitnum /8;
  int offset = bitnum - chunk*8;
  bitmap[chunk] |= 1 << offset;
  return (0);
}